

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd.hpp
# Opt level: O0

void duckdb::alp::AlpRDDecompression<double>::Decompress
               (uint8_t *left_encoded,uint8_t *right_encoded,uint16_t *left_parts_dict,
               EXACT_TYPE *output,idx_t values_count,uint16_t exceptions_count,uint16_t *exceptions,
               uint16_t *exceptions_positions,uint8_t left_bit_width,uint8_t right_bit_width)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  long in_RCX;
  long in_RDX;
  ulong in_R8;
  ushort in_R9W;
  uint16_t left_1;
  EXACT_TYPE right_1;
  idx_t i_1;
  EXACT_TYPE right;
  byte in_stack_00000020;
  uint16_t left;
  idx_t i;
  EXACT_TYPE *right_parts;
  uint16_t *left_parts;
  uint8_t right_decoded [8192];
  uint8_t left_decoded [8192];
  undefined2 in_stack_ffffffffffffbf8e;
  idx_t in_stack_ffffffffffffbf90;
  data_ptr_t in_stack_ffffffffffffbf98;
  ulong uVar3;
  data_ptr_t in_stack_ffffffffffffbfa0;
  ulong local_4050;
  uchar local_4038 [8192];
  uchar local_2038 [8206];
  ushort local_2a;
  ulong local_28;
  long local_20;
  long local_18;
  
  local_2a = in_R9W;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  memset(local_2038,0,0x2000);
  memset(local_4038,0,0x2000);
  BitpackingPrimitives::UnPackBuffer<unsigned_short>
            (in_stack_ffffffffffffbfa0,in_stack_ffffffffffffbf98,in_stack_ffffffffffffbf90,
             (bitpacking_width_t)((ushort)in_stack_ffffffffffffbf8e >> 8),
             SUB21(in_stack_ffffffffffffbf8e,0));
  BitpackingPrimitives::UnPackBuffer<unsigned_long>
            (in_stack_ffffffffffffbfa0,in_stack_ffffffffffffbf98,in_stack_ffffffffffffbf90,
             (bitpacking_width_t)((ushort)in_stack_ffffffffffffbf8e >> 8),
             SUB21(in_stack_ffffffffffffbf8e,0));
  pdVar1 = data_ptr_cast<unsigned_char>(local_2038);
  pdVar2 = data_ptr_cast<unsigned_char>(local_4038);
  for (local_4050 = 0; local_4050 < local_28; local_4050 = local_4050 + 1) {
    *(ulong *)(local_20 + local_4050 * 8) =
         (ulong)*(ushort *)(local_18 + (ulong)*(ushort *)(pdVar1 + local_4050 * 2) * 2) <<
         (in_stack_00000020 & 0x3f) | *(ulong *)(pdVar2 + local_4050 * 8);
  }
  for (uVar3 = 0; uVar3 < local_2a; uVar3 = uVar3 + 1) {
    *(ulong *)(local_20 + (ulong)*(ushort *)(i_1 + uVar3 * 2) * 8) =
         (ulong)*(ushort *)(right_1 + uVar3 * 2) << (in_stack_00000020 & 0x3f) |
         *(ulong *)(pdVar2 + (ulong)*(ushort *)(i_1 + uVar3 * 2) * 8);
  }
  return;
}

Assistant:

static void Decompress(uint8_t *left_encoded, uint8_t *right_encoded, const uint16_t *left_parts_dict,
	                       EXACT_TYPE *output, idx_t values_count, uint16_t exceptions_count,
	                       const uint16_t *exceptions, const uint16_t *exceptions_positions, uint8_t left_bit_width,
	                       uint8_t right_bit_width) {

		uint8_t left_decoded[AlpRDConstants::ALP_VECTOR_SIZE * 8] = {0};
		uint8_t right_decoded[AlpRDConstants::ALP_VECTOR_SIZE * 8] = {0};

		// Bitunpacking left and right parts
		BitpackingPrimitives::UnPackBuffer<uint16_t>(left_decoded, left_encoded, values_count, left_bit_width);
		BitpackingPrimitives::UnPackBuffer<EXACT_TYPE>(right_decoded, right_encoded, values_count, right_bit_width);

		uint16_t *left_parts = reinterpret_cast<uint16_t *>(data_ptr_cast(left_decoded));
		EXACT_TYPE *right_parts = reinterpret_cast<EXACT_TYPE *>(data_ptr_cast(right_decoded));

		// Decoding
		for (idx_t i = 0; i < values_count; i++) {
			uint16_t left = left_parts_dict[left_parts[i]];
			EXACT_TYPE right = right_parts[i];
			output[i] = (static_cast<EXACT_TYPE>(left) << right_bit_width) | right;
		}

		// Exceptions Patching (exceptions only occur in left parts)
		for (idx_t i = 0; i < exceptions_count; i++) {
			EXACT_TYPE right = right_parts[exceptions_positions[i]];
			uint16_t left = exceptions[i];
			output[exceptions_positions[i]] = (static_cast<EXACT_TYPE>(left) << right_bit_width) | right;
		}
	}